

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O0

FT_Error tt_face_vary_cvt(TT_Face face,FT_Stream stream)

{
  short sVar1;
  FT_UShort FVar2;
  FT_UShort tupleIndex_00;
  FT_UShort FVar3;
  FT_Int32 FVar4;
  uint uVar5;
  FT_ULong FVar6;
  FT_Fixed FVar7;
  FT_Short *P;
  uchar *local_110;
  FT_UInt local_f8;
  uchar *local_e0;
  uchar *local_d8;
  uchar *local_d0;
  FT_Long orig_cvt_1;
  int pindex;
  FT_Long orig_cvt;
  FT_Fixed apply;
  FT_UInt tupleIndex;
  FT_UInt tupleDataSize;
  FT_Short *deltas;
  FT_UShort *points;
  FT_UShort *localpoints;
  FT_UShort *sharedpoints;
  FT_UInt spoint_count;
  FT_UInt point_count;
  GX_Blend blend;
  FT_Fixed *im_end_coords;
  FT_Fixed *im_start_coords;
  FT_Fixed *tuple_coords;
  FT_UInt j;
  FT_UInt i;
  FT_ULong here;
  FT_ULong offsetToData;
  FT_ULong FStack_38;
  FT_UInt tupleCount;
  FT_ULong table_len;
  FT_ULong table_start;
  FT_Memory memory;
  FT_Stream pFStack_18;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  table_start = (FT_ULong)stream->memory;
  im_start_coords = (FT_Fixed *)0x0;
  im_end_coords = (FT_Fixed *)0x0;
  blend = (GX_Blend)0x0;
  _spoint_count = face->blend;
  sharedpoints._0_4_ = 0;
  localpoints = (FT_UShort *)0x0;
  points = (FT_UShort *)0x0;
  pFStack_18 = stream;
  stream_local = (FT_Stream)face;
  if (_spoint_count == (GX_Blend)0x0) {
    memory._4_4_ = 0;
  }
  else if (face->cvt == (FT_Short *)0x0) {
    memory._4_4_ = 0;
  }
  else {
    memory._4_4_ = (*face->goto_table)(face,0x63766172,stream,&stack0xffffffffffffffc8);
    if (memory._4_4_ == 0) {
      memory._4_4_ = FT_Stream_EnterFrame(pFStack_18,FStack_38);
      if (memory._4_4_ == 0) {
        table_len = (long)pFStack_18->cursor - (long)pFStack_18->base;
        FVar6 = FT_Stream_GetULong(pFStack_18);
        if (FVar6 == 0x10000) {
          im_start_coords =
               (FT_Fixed *)
               ft_mem_realloc((FT_Memory)table_start,8,0,(ulong)_spoint_count->num_axis,(void *)0x0,
                              (FT_Error *)((long)&memory + 4));
          if (((memory._4_4_ == 0) &&
              (im_end_coords =
                    (FT_Fixed *)
                    ft_mem_realloc((FT_Memory)table_start,8,0,(ulong)_spoint_count->num_axis,
                                   (void *)0x0,(FT_Error *)((long)&memory + 4)), memory._4_4_ == 0))
             && (blend = (GX_Blend)
                         ft_mem_realloc((FT_Memory)table_start,8,0,(ulong)_spoint_count->num_axis,
                                        (void *)0x0,(FT_Error *)((long)&memory + 4)),
                memory._4_4_ == 0)) {
            FVar2 = FT_Stream_GetUShort(pFStack_18);
            offsetToData._4_4_ = (uint)FVar2;
            FVar2 = FT_Stream_GetUShort(pFStack_18);
            here = (FT_ULong)FVar2;
            if (FStack_38 < here + ((offsetToData._4_4_ & 0xfff) << 2)) {
              memory._4_4_ = 8;
            }
            else {
              here = table_len + here;
              if ((offsetToData._4_4_ & 0x8000) != 0) {
                _j = (long)pFStack_18->cursor - (long)pFStack_18->base;
                if (here < (ulong)((long)pFStack_18->limit - (long)pFStack_18->base)) {
                  local_d0 = pFStack_18->base + here;
                }
                else {
                  local_d0 = pFStack_18->limit;
                }
                pFStack_18->cursor = local_d0;
                localpoints = ft_var_readpackedpoints(pFStack_18,FStack_38,(FT_UInt *)&sharedpoints)
                ;
                here = (long)pFStack_18->cursor - (long)pFStack_18->base;
                if (_j < (ulong)((long)pFStack_18->limit - (long)pFStack_18->base)) {
                  local_d8 = pFStack_18->base + _j;
                }
                else {
                  local_d8 = pFStack_18->limit;
                }
                pFStack_18->cursor = local_d8;
              }
              for (tuple_coords._4_4_ = 0; tuple_coords._4_4_ < (offsetToData._4_4_ & 0xfff);
                  tuple_coords._4_4_ = tuple_coords._4_4_ + 1) {
                FVar2 = FT_Stream_GetUShort(pFStack_18);
                tupleIndex_00 = FT_Stream_GetUShort(pFStack_18);
                if ((tupleIndex_00 & 0x8000) == 0) {
                  if (_spoint_count->tuplecount <= (tupleIndex_00 & 0xfff)) {
                    memory._4_4_ = 8;
                    goto LAB_001a768b;
                  }
                  memcpy(im_start_coords,
                         _spoint_count->tuplecoords +
                         (tupleIndex_00 & 0xfff) * _spoint_count->num_axis,
                         (ulong)_spoint_count->num_axis << 3);
                }
                else {
                  for (tuple_coords._0_4_ = 0; (uint)tuple_coords < _spoint_count->num_axis;
                      tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                    FVar3 = FT_Stream_GetUShort(pFStack_18);
                    im_start_coords[(uint)tuple_coords] = (long)((int)(short)FVar3 << 2);
                  }
                }
                if ((tupleIndex_00 & 0x4000) != 0) {
                  for (tuple_coords._0_4_ = 0; (uint)tuple_coords < _spoint_count->num_axis;
                      tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                    FVar3 = FT_Stream_GetUShort(pFStack_18);
                    im_end_coords[(uint)tuple_coords] = (long)((int)(short)FVar3 << 2);
                  }
                  for (tuple_coords._0_4_ = 0; (uint)tuple_coords < _spoint_count->num_axis;
                      tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                    FVar3 = FT_Stream_GetUShort(pFStack_18);
                    *(long *)(&blend->num_axis + (ulong)(uint)tuple_coords * 2) =
                         (long)((int)(short)FVar3 << 2);
                  }
                }
                FVar7 = ft_var_apply_tuple(_spoint_count,tupleIndex_00,im_start_coords,im_end_coords
                                           ,(FT_Fixed *)blend);
                if (FVar7 == 0) {
                  here = (uint)FVar2 + here;
                }
                else {
                  _j = (long)pFStack_18->cursor - (long)pFStack_18->base;
                  if (here < (ulong)((long)pFStack_18->limit - (long)pFStack_18->base)) {
                    local_e0 = pFStack_18->base + here;
                  }
                  else {
                    local_e0 = pFStack_18->limit;
                  }
                  pFStack_18->cursor = local_e0;
                  if ((tupleIndex_00 & 0x2000) == 0) {
                    deltas = (FT_Short *)localpoints;
                    sharedpoints._4_4_ = (FT_UInt)sharedpoints;
                  }
                  else {
                    deltas = (FT_Short *)
                             ft_var_readpackedpoints
                                       (pFStack_18,FStack_38,(FT_UInt *)((long)&sharedpoints + 4));
                    points = (FT_UShort *)deltas;
                  }
                  if (sharedpoints._4_4_ == 0) {
                    local_f8 = (FT_UInt)stream_local[0xd].read;
                  }
                  else {
                    local_f8 = sharedpoints._4_4_;
                  }
                  P = ft_var_readpackeddeltas(pFStack_18,FStack_38,local_f8);
                  if (((deltas != (FT_Short *)0x0) && (P != (FT_Short *)0x0)) &&
                     ((points != (FT_UShort *)0xffffffffffffffff ||
                      ((FT_Stream_IoFunc)(ulong)sharedpoints._4_4_ == stream_local[0xd].read)))) {
                    if (points == (FT_UShort *)0xffffffffffffffff) {
                      for (tuple_coords._0_4_ = 0;
                          (FT_Stream_IoFunc)(ulong)(uint)tuple_coords < stream_local[0xd].read;
                          tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                        sVar1 = *(short *)(stream_local[0xd].close + (ulong)(uint)tuple_coords * 2);
                        FVar4 = FT_MulFix_x86_64((int)P[(uint)tuple_coords],(FT_Int32)FVar7);
                        *(short *)(stream_local[0xd].close + (ulong)(uint)tuple_coords * 2) =
                             sVar1 + (short)FVar4;
                      }
                    }
                    else {
                      for (tuple_coords._0_4_ = 0; (uint)tuple_coords < sharedpoints._4_4_;
                          tuple_coords._0_4_ = (uint)tuple_coords + 1) {
                        uVar5 = (uint)(ushort)deltas[(uint)tuple_coords];
                        if ((FT_Stream_IoFunc)(long)(int)uVar5 < stream_local[0xd].read) {
                          sVar1 = *(short *)(stream_local[0xd].close + (long)(int)uVar5 * 2);
                          FVar4 = FT_MulFix_x86_64((int)P[(uint)tuple_coords],(FT_Int32)FVar7);
                          *(short *)(stream_local[0xd].close + (long)(int)uVar5 * 2) =
                               sVar1 + (short)FVar4;
                        }
                      }
                    }
                  }
                  if (points != (FT_UShort *)0xffffffffffffffff) {
                    ft_mem_free((FT_Memory)table_start,points);
                    points = (FT_UShort *)0x0;
                  }
                  ft_mem_free((FT_Memory)table_start,P);
                  here = (uint)FVar2 + here;
                  if (_j < (ulong)((long)pFStack_18->limit - (long)pFStack_18->base)) {
                    local_110 = pFStack_18->base + _j;
                  }
                  else {
                    local_110 = pFStack_18->limit;
                  }
                  pFStack_18->cursor = local_110;
                }
              }
            }
          }
        }
        else {
          memory._4_4_ = 0;
        }
        FT_Stream_ExitFrame(pFStack_18);
      }
      else {
        memory._4_4_ = 0;
      }
    }
    else {
      memory._4_4_ = 0;
    }
  }
LAB_001a768b:
  if (localpoints != (FT_UShort *)0xffffffffffffffff) {
    ft_mem_free((FT_Memory)table_start,localpoints);
  }
  ft_mem_free((FT_Memory)table_start,im_start_coords);
  im_start_coords = (FT_Fixed *)0x0;
  ft_mem_free((FT_Memory)table_start,im_end_coords);
  im_end_coords = (FT_Fixed *)0x0;
  ft_mem_free((FT_Memory)table_start,blend);
  return memory._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_vary_cvt( TT_Face    face,
                    FT_Stream  stream )
  {
    FT_Error    error;
    FT_Memory   memory = stream->memory;
    FT_ULong    table_start;
    FT_ULong    table_len;
    FT_UInt     tupleCount;
    FT_ULong    offsetToData;
    FT_ULong    here;
    FT_UInt     i, j;
    FT_Fixed*   tuple_coords    = NULL;
    FT_Fixed*   im_start_coords = NULL;
    FT_Fixed*   im_end_coords   = NULL;
    GX_Blend    blend           = face->blend;
    FT_UInt     point_count, spoint_count = 0;
    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;
    FT_Short*   deltas;


    FT_TRACE2(( "CVAR " ));

    if ( !blend )
    {
      FT_TRACE2(( "\n"
                  "tt_face_vary_cvt: no blend specified\n" ));
      error = FT_Err_Ok;
      goto Exit;
    }

    if ( !face->cvt )
    {
      FT_TRACE2(( "\n"
                  "tt_face_vary_cvt: no `cvt ' table\n" ));
      error = FT_Err_Ok;
      goto Exit;
    }

    error = face->goto_table( face, TTAG_cvar, stream, &table_len );
    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));

      error = FT_Err_Ok;
      goto Exit;
    }

    if ( FT_FRAME_ENTER( table_len ) )
    {
      error = FT_Err_Ok;
      goto Exit;
    }

    table_start = FT_Stream_FTell( stream );
    if ( FT_GET_LONG() != 0x00010000L )
    {
      FT_TRACE2(( "bad table version\n" ));

      error = FT_Err_Ok;
      goto FExit;
    }

    FT_TRACE2(( "loaded\n" ));

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto FExit;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData + ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 >
           table_len )
    {
      FT_TRACE2(( "tt_face_vary_cvt:"
                  " invalid CVT variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto FExit;
    }

    offsetToData += table_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              table_len,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "cvar: there %s %d tuple%s:\n",
                ( tupleCount & 0xFFF ) == 1 ? "is" : "are",
                tupleCount & 0xFFF,
                ( tupleCount & 0xFFF ) == 1 ? "" : "s" ));

    for ( i = 0; i < ( tupleCount & 0xFFF ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_GET_SHORT() * 4;  /* convert from        */
                                                 /* short frac to fixed */
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "tt_face_vary_cvt:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Exit;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          &blend->tuplecoords[( tupleIndex & 0xFFF ) * blend->num_axis],
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_GET_SHORT() * 4;
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_GET_SHORT() * 4;
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               table_len,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas = ft_var_readpackeddeltas( stream,
                                        table_len,
                                        point_count == 0 ? face->cvt_size
                                                         : point_count );

      if ( !points                                                        ||
           !deltas                                                        ||
           ( localpoints == ALL_POINTS && point_count != face->cvt_size ) )
        ; /* failure, ignore it */

      else if ( localpoints == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    CVT deltas:\n" ));

        /* this means that there are deltas for every entry in cvt */
        for ( j = 0; j < face->cvt_size; j++ )
        {
          FT_Long  orig_cvt = face->cvt[j];


          face->cvt[j] = (FT_Short)( orig_cvt +
                                     FT_MulFix( deltas[j], apply ) );

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( orig_cvt != face->cvt[j] )
          {
            FT_TRACE7(( "      %d: %d -> %d\n",
                        j, orig_cvt, face->cvt[j] ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    CVT deltas:\n" ));

        for ( j = 0; j < point_count; j++ )
        {
          int      pindex;
          FT_Long  orig_cvt;


          pindex = points[j];
          if ( (FT_ULong)pindex >= face->cvt_size )
            continue;

          orig_cvt          = face->cvt[pindex];
          face->cvt[pindex] = (FT_Short)( orig_cvt +
                                          FT_MulFix( deltas[j], apply ) );

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( orig_cvt != face->cvt[pindex] )
          {
            FT_TRACE7(( "      %d: %d -> %d\n",
                        pindex, orig_cvt, face->cvt[pindex] ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

  FExit:
    FT_FRAME_EXIT();

  Exit:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    return error;
  }